

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  input_t iVar1;
  rep rVar2;
  type elapsed;
  time_point t0;
  input_t input;
  advent_t *A;
  advent_t *__end1;
  advent_t *__begin1;
  advent_t (*__range1) [25];
  double total_time;
  string *in_stack_ffffffffffffff98;
  type in_stack_ffffffffffffffa0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_40;
  ssize_t local_38;
  advent_t *local_20;
  double local_10;
  
  local_10 = 0.0;
  for (local_20 = advent2018; local_20 != (advent_t *)&load_input::backsplash;
      local_20 = local_20 + 1) {
    load_input((input_t *)in_stack_ffffffffffffffa0.__r,in_stack_ffffffffffffff98);
    std::chrono::_V2::steady_clock::now();
    iVar1.len = local_38;
    iVar1.s = (char *)local_40;
    __lhs = local_40;
    (*local_20->fn)(iVar1);
    in_stack_ffffffffffffff98 = (string *)std::chrono::_V2::steady_clock::now();
    in_stack_ffffffffffffffa0 = std::chrono::operator-(__lhs,in_stack_ffffffffffffffa0.__r);
    free_input((input_t *)0x103404);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffa0);
    local_10 = (double)rVar2 + local_10;
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffa0);
    printf(anon_var_dwarf_2e08,(long)((double)rVar2 * 0.001));
  }
  printf(anon_var_dwarf_2e1e,(long)(local_10 * 0.001));
  return 0;
}

Assistant:

int main() {
	double total_time = 0;

	for (auto &A : advent2018) {
		input_t input;

		load_input(input, A.input_file);
		auto t0 = std::chrono::steady_clock::now();
		(*A.fn)(input);
		auto elapsed = std::chrono::steady_clock::now() - t0;
		free_input(input);

		total_time += elapsed.count();
		printf("[%ld μs]\n", int64_t(elapsed.count() * 1e-3));
	}
	printf("Total: %ld μs\n", int64_t(total_time * 1e-3));

	return 0;
}